

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265_stream.cpp
# Opt level: O0

void h265_read_vps_rbsp(h265_stream_t *h,bs_t *b)

{
  h265_vps_t *__s;
  uint32_t uVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  uint32_t *puVar6;
  byte *pbVar7;
  uint local_3c;
  uint local_34;
  int sps_extension_data_flag;
  uint k;
  h265_vps_t *vps;
  int local_20;
  int vps_video_parameter_set_id;
  int j;
  int i;
  bs_t *b_local;
  h265_stream_t *h_local;
  
  uVar1 = bs_read_u(b,4);
  h->vps = h->vps_table[(int)uVar1];
  __s = h->vps;
  memset(__s,0,0x4f0);
  __s->vps_video_parameter_set_id = (uint8_t)uVar1;
  uVar1 = bs_read_u1(b);
  __s->vps_base_layer_internal_flag = (uint8_t)uVar1;
  uVar1 = bs_read_u1(b);
  __s->vps_base_layer_available_flag = (uint8_t)uVar1;
  uVar1 = bs_read_u(b,6);
  __s->vps_max_layers_minus1 = (uint8_t)uVar1;
  uVar1 = bs_read_u(b,3);
  __s->vps_max_sub_layers_minus1 = (uint8_t)uVar1;
  uVar1 = bs_read_u1(b);
  __s->vps_temporal_id_nesting_flag = (uint8_t)uVar1;
  uVar1 = bs_read_u(b,0x10);
  __s->vps_reserved_0xffff_16bits = uVar1;
  h265_read_ptl(&__s->ptl,b,1,(uint)__s->vps_max_sub_layers_minus1);
  h->info->profile_idc = (uint)(__s->ptl).general_profile_idc;
  h->info->level_idc = (uint)(__s->ptl).general_level_idc;
  h->info->tier_idc = (uint)(__s->ptl).general_tier_flag;
  uVar1 = bs_read_u1(b);
  __s->vps_sub_layer_ordering_info_present_flag = (uint8_t)uVar1;
  if (__s->vps_sub_layer_ordering_info_present_flag == '\0') {
    local_3c = (uint)__s->vps_max_sub_layers_minus1;
  }
  else {
    local_3c = 0;
  }
  for (vps_video_parameter_set_id = local_3c;
      vps_video_parameter_set_id <= (int)(uint)__s->vps_max_sub_layers_minus1;
      vps_video_parameter_set_id = vps_video_parameter_set_id + 1) {
    uVar1 = bs_read_ue(b);
    __s->vps_max_dec_pic_buffering_minus1[vps_video_parameter_set_id] = uVar1;
    uVar1 = bs_read_ue(b);
    __s->vps_max_num_reorder_pics[vps_video_parameter_set_id] = uVar1;
    uVar1 = bs_read_ue(b);
    __s->vps_max_latency_increase_plus1[vps_video_parameter_set_id] = uVar1;
  }
  uVar1 = bs_read_u(b,6);
  __s->vps_max_layer_id = (uint8_t)uVar1;
  uVar1 = bs_read_ue(b);
  __s->vps_num_layer_sets_minus1 = uVar1;
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::resize(&__s->layer_id_included_flag,(long)(__s->vps_num_layer_sets_minus1 + 1));
  for (local_34 = 0;
      sVar3 = std::
              vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::size(&__s->layer_id_included_flag), local_34 < sVar3; local_34 = local_34 + 1) {
    pvVar4 = std::
             vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::operator[](&__s->layer_id_included_flag,(ulong)local_34);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (pvVar4,(ulong)__s->vps_max_layer_id);
  }
  for (vps_video_parameter_set_id = 1; vps_video_parameter_set_id <= __s->vps_num_layer_sets_minus1;
      vps_video_parameter_set_id = vps_video_parameter_set_id + 1) {
    pvVar4 = std::
             vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::operator[](&__s->layer_id_included_flag,(long)vps_video_parameter_set_id);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (pvVar4,(long)(__s->vps_num_layer_sets_minus1 + 1));
  }
  for (vps_video_parameter_set_id = 1; vps_video_parameter_set_id <= __s->vps_num_layer_sets_minus1;
      vps_video_parameter_set_id = vps_video_parameter_set_id + 1) {
    for (local_20 = 0; local_20 <= (int)(uint)__s->vps_max_layer_id; local_20 = local_20 + 1) {
      uVar1 = bs_read_u1(b);
      pvVar4 = std::
               vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator[](&__s->layer_id_included_flag,(long)vps_video_parameter_set_id);
      pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (pvVar4,(long)local_20);
      *pvVar5 = (value_type)uVar1;
    }
  }
  uVar1 = bs_read_u1(b);
  __s->vps_timing_info_present_flag = (uint8_t)uVar1;
  if (__s->vps_timing_info_present_flag != '\0') {
    uVar1 = bs_read_u(b,0x20);
    __s->vps_num_units_in_tick = uVar1;
    uVar1 = bs_read_u(b,0x20);
    __s->vps_time_scale = uVar1;
    uVar1 = bs_read_u1(b);
    __s->vps_poc_proportional_to_timing_flag = (uint8_t)uVar1;
    if (__s->vps_poc_proportional_to_timing_flag != '\0') {
      uVar1 = bs_read_ue(b);
      __s->vps_num_ticks_poc_diff_one_minus1 = uVar1;
    }
    uVar1 = bs_read_ue(b);
    __s->vps_num_hrd_parameters = uVar1;
    std::vector<int,_std::allocator<int>_>::resize
              (&__s->hrd_layer_set_idx,(long)__s->vps_num_hrd_parameters);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&__s->cprms_present_flag,(long)__s->vps_num_hrd_parameters);
    std::vector<int,_std::allocator<int>_>::resize
              (&__s->hrd_layer_set_idx,(long)__s->vps_num_hrd_parameters);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&__s->cprms_present_flag,(long)__s->vps_num_hrd_parameters);
    for (vps_video_parameter_set_id = 0; vps_video_parameter_set_id < __s->vps_num_hrd_parameters;
        vps_video_parameter_set_id = vps_video_parameter_set_id + 1) {
      uVar1 = bs_read_ue(b);
      puVar6 = (uint32_t *)
               std::vector<int,_std::allocator<int>_>::operator[]
                         (&__s->hrd_layer_set_idx,(long)vps_video_parameter_set_id);
      *puVar6 = uVar1;
      if (0 < vps_video_parameter_set_id) {
        uVar1 = bs_read_u1(b);
        pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (&__s->cprms_present_flag,(long)vps_video_parameter_set_id);
        *pvVar5 = (value_type)uVar1;
      }
      pbVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&__s->cprms_present_flag,(long)vps_video_parameter_set_id);
      h265_read_hrd_parameters
                (&__s->hrd_parameters,b,(uint)*pbVar7,(uint)__s->vps_max_sub_layers_minus1);
    }
  }
  uVar1 = bs_read_u1(b);
  __s->vps_extension_flag = (uint8_t)uVar1;
  if (__s->vps_extension_flag != '\0') {
    while (iVar2 = h265_more_rbsp_trailing_data(b), iVar2 != 0) {
      bs_read_u1(b);
    }
  }
  h265_read_rbsp_trailing_bits(b);
  return;
}

Assistant:

void  h265_read_vps_rbsp(h265_stream_t* h, bs_t* b)
{
    int i = 0;
    int j = 0;

    int vps_video_parameter_set_id  = bs_read_u(b, 4);
    // 选择正确的sps表
    h->vps = h->vps_table[vps_video_parameter_set_id];
    h265_vps_t* vps = h->vps;
    memset(vps, 0, sizeof(h265_vps_t));

    vps->vps_video_parameter_set_id    = vps_video_parameter_set_id;
    vps->vps_base_layer_internal_flag  = bs_read_u1(b);
    vps->vps_base_layer_available_flag = bs_read_u1(b);
    vps->vps_max_layers_minus1         = bs_read_u(b, 6);
    vps->vps_max_sub_layers_minus1     = bs_read_u(b, 3);
    vps->vps_temporal_id_nesting_flag  = bs_read_u1(b);
    vps->vps_reserved_0xffff_16bits    = bs_read_u(b, 16);

    // profile tier level...
    h265_read_ptl(&vps->ptl, b, 1, vps->vps_max_sub_layers_minus1);
    h->info->profile_idc = vps->ptl.general_profile_idc;
    h->info->level_idc   = vps->ptl.general_level_idc;
    h->info->tier_idc    = vps->ptl.general_tier_flag;

    vps->vps_sub_layer_ordering_info_present_flag = bs_read_u1(b);
    for (i = (vps->vps_sub_layer_ordering_info_present_flag ? 0 : vps->vps_max_sub_layers_minus1);
         i <= vps->vps_max_sub_layers_minus1; i++ )
    {
        vps->vps_max_dec_pic_buffering_minus1[i] = bs_read_ue(b);
        vps->vps_max_num_reorder_pics[i]         = bs_read_ue(b);
        vps->vps_max_latency_increase_plus1[i]   = bs_read_ue(b);
    }
    vps->vps_max_layer_id           = bs_read_u(b, 6);
    vps->vps_num_layer_sets_minus1  = bs_read_ue(b);
    vps->layer_id_included_flag.resize(vps->vps_num_layer_sets_minus1+1);
    for (unsigned int k = 0; k < vps->layer_id_included_flag.size(); k++)
    {
        vps->layer_id_included_flag[k].resize(vps->vps_max_layer_id);
    }
    for (i = 1; i <= vps->vps_num_layer_sets_minus1; i++)
    {
        vps->layer_id_included_flag[i].resize(vps->vps_num_layer_sets_minus1+1);
    }
    for (i = 1; i <= vps->vps_num_layer_sets_minus1; i++)
    {
        for (j = 0; j <= vps->vps_max_layer_id; j++)
        {
            vps->layer_id_included_flag[i][j] = bs_read_u1(b);
        }
    }
    vps->vps_timing_info_present_flag = bs_read_u1(b);
    if (vps->vps_timing_info_present_flag)
    {
        vps->vps_num_units_in_tick = bs_read_u(b, 32);
        vps->vps_time_scale = bs_read_u(b, 32);
        vps->vps_poc_proportional_to_timing_flag = bs_read_u1(b);
        if (vps->vps_poc_proportional_to_timing_flag)
        {
            vps->vps_num_ticks_poc_diff_one_minus1 = bs_read_ue(b);
        }
        vps->vps_num_hrd_parameters  = bs_read_ue(b);
        vps->hrd_layer_set_idx.resize(vps->vps_num_hrd_parameters);
        vps->cprms_present_flag.resize(vps->vps_num_hrd_parameters);
        vps->hrd_layer_set_idx.resize(vps->vps_num_hrd_parameters);
        vps->cprms_present_flag.resize(vps->vps_num_hrd_parameters);
        for (i = 0; i < vps->vps_num_hrd_parameters; i++)
        {
            vps->hrd_layer_set_idx[i] = bs_read_ue(b);
            if (i > 0)
            {
                vps->cprms_present_flag[i] = bs_read_u1(b);
            }
            //  hrd_parameters()
            h265_read_hrd_parameters(&(vps->hrd_parameters), b, vps->cprms_present_flag[i], vps->vps_max_sub_layers_minus1);
        }
    }
    vps->vps_extension_flag  = bs_read_u1(b);
    if (vps->vps_extension_flag)
    {
        while (h265_more_rbsp_trailing_data(b))
        {
            int sps_extension_data_flag = bs_read_u1(b);
        }
    }
    h265_read_rbsp_trailing_bits(b);
}